

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrc.c
# Opt level: O0

UInt32 CrcUpdateT1(UInt32 v,void *data,size_t size,UInt32 *table)

{
  Byte *pEnd;
  Byte *p;
  UInt32 *table_local;
  size_t size_local;
  void *data_local;
  UInt32 v_local;
  
  v_local = v;
  for (p = (Byte *)data; p != (Byte *)((long)data + size); p = p + 1) {
    v_local = table[(v_local ^ *p) & 0xff] ^ v_local >> 8;
  }
  return v_local;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT1(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  const Byte *pEnd = p + size;
  for (; p != pEnd; p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}